

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8_fp16.h
# Opt level: O1

void ncnn::convdw3x3s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  long lVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  
  iVar9 = bottom_blob->c;
  if (0 < (long)iVar9) {
    uVar10 = top_blob->w;
    iVar11 = top_blob->h;
    pvVar12 = _bias->data;
    lVar36 = 0;
    do {
      if (pvVar12 == (void *)0x0) {
        auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar47 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar12 + lVar36 * 0x20));
      }
      pauVar39 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar36 * top_blob->elemsize + (long)top_blob->data);
      lVar30 = kernel->w * lVar36 * kernel->elemsize;
      pvVar13 = kernel->data;
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30));
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x10));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x20));
      auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x30));
      auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x40));
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x50));
      auVar20 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x60));
      auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x70));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar13 + lVar30 + 0x80));
      if (0 < iVar11) {
        auVar23 = vcvtph2ps_f16c(auVar14);
        auVar24 = vcvtph2ps_f16c(auVar15);
        auVar25 = vcvtph2ps_f16c(auVar16);
        auVar44 = ZEXT3264(auVar25);
        auVar25 = vcvtph2ps_f16c(auVar17);
        auVar42 = ZEXT3264(auVar25);
        auVar25 = vcvtph2ps_f16c(auVar18);
        auVar26 = vcvtph2ps_f16c(auVar19);
        auVar27 = vcvtph2ps_f16c(auVar20);
        auVar28 = vcvtph2ps_f16c(auVar21);
        auVar29 = vcvtph2ps_f16c(auVar22);
        pauVar40 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar36 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar30 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar38 = (undefined1 (*) [32])(*pauVar40 + lVar30 * 2);
        pauVar37 = (undefined1 (*) [32])(*pauVar40 + lVar30);
        iVar31 = 0;
        auVar45 = auVar47._0_32_;
        do {
          if ((int)uVar10 < 8) {
            uVar34 = 0;
          }
          else {
            iVar32 = 7;
            auVar41 = auVar42._0_32_;
            auVar43 = auVar44._0_32_;
            do {
              auVar14 = vfmadd213ps_fma(*pauVar40,auVar23,auVar47._0_32_);
              auVar46 = pauVar40[1];
              auVar1 = pauVar40[2];
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar1);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,*pauVar37);
              auVar2 = pauVar40[3];
              auVar3 = pauVar37[1];
              auVar4 = pauVar37[2];
              auVar5 = pauVar37[3];
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,*pauVar38);
              auVar6 = pauVar38[1];
              auVar7 = pauVar38[2];
              auVar8 = pauVar38[3];
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar7);
              *pauVar39 = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar46,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar1,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar2);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar4,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar8);
              auVar46 = pauVar40[4];
              auVar3 = pauVar37[4];
              auVar6 = pauVar38[4];
              pauVar39[1] = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar1,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar2,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar5,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar8);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar6);
              auVar1 = pauVar40[5];
              auVar4 = pauVar37[5];
              auVar7 = pauVar38[5];
              pauVar39[2] = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar2,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar46,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar1);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar3,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar8);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar7);
              auVar2 = pauVar40[6];
              auVar5 = pauVar37[6];
              auVar8 = pauVar38[6];
              pauVar39[3] = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar46,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar1,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar2);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar4,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar8);
              auVar46 = pauVar40[7];
              auVar3 = pauVar37[7];
              auVar6 = pauVar38[7];
              pauVar39[4] = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar1,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar2,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar5,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar8);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar6);
              auVar1 = pauVar40[8];
              auVar4 = pauVar37[8];
              auVar7 = pauVar38[8];
              pauVar39[5] = ZEXT1632(auVar14);
              auVar47 = ZEXT3264(auVar45);
              auVar14 = vfmadd132ps_fma(auVar2,auVar45,auVar23);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar46,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar1);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar4);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar8);
              auVar14 = vfmadd213ps_fma(auVar46,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar1,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,pauVar40[9]);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,auVar4);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar28,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,pauVar37[9]);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar6);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar29,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,pauVar38[9]);
              pauVar39[6] = ZEXT1632(auVar15);
              pauVar39[7] = ZEXT1632(auVar14);
              pauVar40 = pauVar40 + 8;
              pauVar37 = pauVar37 + 8;
              pauVar38 = pauVar38 + 8;
              pauVar39 = pauVar39 + 8;
              iVar32 = iVar32 + 8;
            } while (iVar32 < (int)uVar10);
            auVar44 = ZEXT3264(auVar43);
            auVar42 = ZEXT3264(auVar41);
            uVar34 = uVar10 & 0xfffffff8;
          }
          if ((int)(uVar34 | 3) < (int)uVar10) {
            auVar41 = auVar42._0_32_;
            auVar43 = auVar44._0_32_;
            lVar30 = 0;
            uVar33 = uVar34;
            do {
              lVar35 = lVar30;
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(*pauVar40 + lVar35),auVar23,
                                        auVar47._0_32_);
              auVar46 = *(undefined1 (*) [32])(pauVar40[1] + lVar35);
              auVar1 = *(undefined1 (*) [32])(pauVar40[2] + lVar35);
              auVar2 = *(undefined1 (*) [32])(pauVar40[3] + lVar35);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar1);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar35));
              auVar3 = *(undefined1 (*) [32])(pauVar37[1] + lVar35);
              auVar4 = *(undefined1 (*) [32])(pauVar37[2] + lVar35);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,
                                        *(undefined1 (*) [32])(*pauVar38 + lVar35));
              auVar5 = *(undefined1 (*) [32])(pauVar37[3] + lVar35);
              auVar6 = *(undefined1 (*) [32])(pauVar38[1] + lVar35);
              auVar7 = *(undefined1 (*) [32])(pauVar38[2] + lVar35);
              auVar8 = *(undefined1 (*) [32])(pauVar38[3] + lVar35);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar7);
              *(undefined1 (*) [32])((long)*pauVar39 + lVar35) = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar46,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar1,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar2);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar4,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar7);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar8);
              auVar46 = *(undefined1 (*) [32])(pauVar40[4] + lVar35);
              auVar3 = *(undefined1 (*) [32])(pauVar37[4] + lVar35);
              auVar6 = *(undefined1 (*) [32])(pauVar38[4] + lVar35);
              *(undefined1 (*) [32])(pauVar39[1] + lVar35) = ZEXT1632(auVar14);
              auVar14 = vfmadd213ps_fma(auVar1,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar2,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar5,auVar25);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,auVar3);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar7);
              auVar14 = vfmadd213ps_fma(auVar2,auVar23,auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,
                                        *(undefined1 (*) [32])(pauVar40[5] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,auVar5);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar3,auVar25);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar28,auVar8);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,
                                        *(undefined1 (*) [32])(pauVar37[5] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar8);
              auVar47 = ZEXT3264(auVar45);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,
                                        *(undefined1 (*) [32])(pauVar38[5] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar29,auVar6);
              *(undefined1 (*) [32])(pauVar39[2] + lVar35) = ZEXT1632(auVar15);
              *(undefined1 (*) [32])(pauVar39[3] + lVar35) = ZEXT1632(auVar14);
              uVar34 = uVar33 + 4;
              iVar32 = uVar33 + 7;
              lVar30 = lVar35 + 0x80;
              uVar33 = uVar34;
            } while (iVar32 < (int)uVar10);
            pauVar39 = (undefined1 (*) [32])(pauVar39[4] + lVar35);
            pauVar40 = (undefined1 (*) [32])(pauVar40[4] + lVar35);
            pauVar37 = (undefined1 (*) [32])(pauVar37[4] + lVar35);
            pauVar38 = (undefined1 (*) [32])(pauVar38[4] + lVar35);
            auVar44 = ZEXT3264(auVar43);
            auVar42 = ZEXT3264(auVar41);
          }
          auVar46 = auVar47._0_32_;
          auVar43 = auVar44._0_32_;
          auVar41 = auVar42._0_32_;
          if ((int)(uVar34 | 1) < (int)uVar10) {
            lVar30 = 0;
            uVar33 = uVar34;
            do {
              lVar35 = lVar30;
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(*pauVar40 + lVar35),auVar23,auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,
                                        *(undefined1 (*) [32])(pauVar40[1] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,
                                        *(undefined1 (*) [32])(pauVar40[2] + lVar35));
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar40[1] + lVar35),auVar23,auVar46
                                       );
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,
                                        *(undefined1 (*) [32])(pauVar40[2] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar41,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,
                                        *(undefined1 (*) [32])(pauVar40[3] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar25,
                                        *(undefined1 (*) [32])(pauVar37[1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,
                                        *(undefined1 (*) [32])(pauVar37[1] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar26,
                                        *(undefined1 (*) [32])(pauVar37[2] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,
                                        *(undefined1 (*) [32])(pauVar37[2] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,
                                        *(undefined1 (*) [32])(*pauVar38 + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar28,
                                        *(undefined1 (*) [32])(pauVar38[1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,
                                        *(undefined1 (*) [32])(pauVar37[3] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,
                                        *(undefined1 (*) [32])(pauVar38[1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,
                                        *(undefined1 (*) [32])(pauVar38[2] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,
                                        *(undefined1 (*) [32])(pauVar38[3] + lVar35));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar29,
                                        *(undefined1 (*) [32])(pauVar38[2] + lVar35));
              *(undefined1 (*) [32])((long)*pauVar39 + lVar35) = ZEXT1632(auVar15);
              *(undefined1 (*) [32])(pauVar39[1] + lVar35) = ZEXT1632(auVar14);
              uVar34 = uVar33 + 2;
              iVar32 = uVar33 + 3;
              lVar30 = lVar35 + 0x40;
              uVar33 = uVar34;
            } while (iVar32 < (int)uVar10);
            pauVar39 = (undefined1 (*) [32])(pauVar39[2] + lVar35);
            pauVar40 = (undefined1 (*) [32])(pauVar40[2] + lVar35);
            pauVar37 = (undefined1 (*) [32])(pauVar37[2] + lVar35);
            pauVar38 = (undefined1 (*) [32])(pauVar38[2] + lVar35);
          }
          iVar32 = uVar10 - uVar34;
          if (iVar32 != 0 && (int)uVar34 <= (int)uVar10) {
            lVar35 = 0x40;
            lVar30 = 0;
            do {
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar40[-2] + lVar35),auVar23,
                                        auVar46);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,
                                        *(undefined1 (*) [32])(pauVar40[-1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar43,
                                        *(undefined1 (*) [32])(*pauVar40 + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar41,
                                        *(undefined1 (*) [32])(pauVar37[-2] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,
                                        *(undefined1 (*) [32])(pauVar37[-1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,
                                        *(undefined1 (*) [32])(pauVar38[-2] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,
                                        *(undefined1 (*) [32])(pauVar38[-1] + lVar35));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,
                                        *(undefined1 (*) [32])(*pauVar38 + lVar35));
              *(undefined1 (*) [32])(pauVar39[-2] + lVar35) = ZEXT1632(auVar14);
              lVar30 = lVar30 + -0x20;
              lVar35 = lVar35 + 0x20;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
            pauVar39 = (undefined1 (*) [32])((long)pauVar39 - lVar30);
            pauVar40 = (undefined1 (*) [32])((long)pauVar40 - lVar30);
            pauVar37 = (undefined1 (*) [32])((long)pauVar37 - lVar30);
            pauVar38 = (undefined1 (*) [32])((long)pauVar38 - lVar30);
          }
          pauVar40 = pauVar40 + 2;
          pauVar37 = pauVar37 + 2;
          pauVar38 = pauVar38 + 2;
          iVar31 = iVar31 + 1;
        } while (iVar31 != iVar11);
      }
      lVar36 = lVar36 + 1;
    } while (lVar36 != iVar9);
  }
  return;
}

Assistant:

static void convdw3x3s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const unsigned short* k0 = (const unsigned short*)kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = loadfp16(k0);
        __m256 _k01 = loadfp16(k0 + 8);
        __m256 _k02 = loadfp16(k0 + 16);
        __m256 _k10 = loadfp16(k0 + 24);
        __m256 _k11 = loadfp16(k0 + 32);
        __m256 _k12 = loadfp16(k0 + 40);
        __m256 _k20 = loadfp16(k0 + 48);
        __m256 _k21 = loadfp16(k0 + 56);
        __m256 _k22 = loadfp16(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}